

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O1

void __thiscall
duckdb::ConcurrentQueue::Enqueue
          (ConcurrentQueue *this,ProducerToken *token,shared_ptr<duckdb::Task,_true> *task)

{
  bool bVar1;
  int iVar2;
  Task *pTVar3;
  pointer pQVar4;
  InternalException *this_00;
  __sighandler_t __handler;
  string local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&token->producer_lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  pTVar3 = shared_ptr<duckdb::Task,_true>::operator->(task);
  (pTVar3->token).ptr = token;
  pQVar4 = unique_ptr<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>,_true>
           ::operator->(&token->token);
  bVar1 = duckdb_moodycamel::
          ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::ExplicitProducer::
          enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::shared_ptr<duckdb::Task,true>>
                    ((ExplicitProducer *)&(pQVar4->queue_token).producer[-1].token,task);
  if (bVar1) {
    duckdb_moodycamel::LightweightSemaphore::signal(&this->semaphore,1,__handler);
    pthread_mutex_unlock((pthread_mutex_t *)&token->producer_lock);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Could not schedule task!","");
  InternalException::InternalException(this_00,&local_48);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ConcurrentQueue::Enqueue(ProducerToken &token, shared_ptr<Task> task) {
	lock_guard<mutex> producer_lock(token.producer_lock);
	task->token = token;
	if (q.enqueue(token.token->queue_token, std::move(task))) {
		semaphore.signal();
	} else {
		throw InternalException("Could not schedule task!");
	}
}